

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O2

Cont * __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Pop
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  size_t *psVar1;
  Cont *pCVar2;
  
  psVar1 = (size_t *)
           ContinuousPageStack<1UL>::Pop(&this->super_ContinuousPageStack<1UL>,this->topElementSize)
  ;
  if (psVar1 == (size_t *)0x0) {
    pCVar2 = (Cont *)0x0;
  }
  else {
    this->topElementSize = *psVar1;
    pCVar2 = (Cont *)(psVar1 + 1);
  }
  return pCVar2;
}

Assistant:

inline T* ContinuousPageStackOfVariableElements<T, InitialPageCount>::Pop()
{
    VariableElement *const element = reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Pop(topElementSize));
    if (element == 0)
        return 0;
    else
    {
        topElementSize = element->PreviousElementSize();
        return reinterpret_cast<T*>(element->Data());
    }
}